

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_gost2015.c
# Opt level: O2

int gost2015_process_unprotected_attributes
              (stack_st_X509_ATTRIBUTE *attrs,int encryption,size_t mac_len,uchar *final_tag)

{
  uint uVar1;
  ASN1_OBJECT *pAVar2;
  stack_st_X509_ATTRIBUTE *psVar3;
  int *piVar4;
  int len;
  stack_st_X509_ATTRIBUTE *attrs_local;
  
  len = (int)mac_len;
  attrs_local = attrs;
  if (encryption == 0) {
    pAVar2 = OBJ_txt2obj("1.2.643.7.1.0.6.1.1",1);
    piVar4 = (int *)X509at_get0_data_by_OBJ((stack_st_X509_ATTRIBUTE *)attrs,pAVar2,-3,4);
    uVar1 = 0xffffffff;
    if ((piVar4 != (int *)0x0) && (*piVar4 == len)) {
      memcpy(final_tag,*(void **)(piVar4 + 2),(long)len);
      uVar1 = 1;
    }
  }
  else if (attrs == (stack_st_X509_ATTRIBUTE *)0x0) {
    uVar1 = 0xffffffff;
  }
  else {
    pAVar2 = OBJ_txt2obj("1.2.643.7.1.0.6.1.1",1);
    psVar3 = X509at_add1_attr_by_OBJ
                       ((stack_st_X509_ATTRIBUTE **)&attrs_local,pAVar2,4,final_tag,len);
    uVar1 = -(uint)(psVar3 == (stack_st_X509_ATTRIBUTE *)0x0) | 1;
  }
  return uVar1;
}

Assistant:

int gost2015_process_unprotected_attributes(
    STACK_OF(X509_ATTRIBUTE) *attrs,
    int encryption, size_t mac_len, unsigned char *final_tag)
{
    if (encryption == 0) /*Decrypting*/ {
        ASN1_OCTET_STRING *osExpectedMac = X509at_get0_data_by_OBJ(attrs,
            OBJ_txt2obj(OID_GOST_CMS_MAC, 1), -3, V_ASN1_OCTET_STRING);

        if (!osExpectedMac || osExpectedMac->length != (int)mac_len)
            return -1;

        memcpy(final_tag, osExpectedMac->data, osExpectedMac->length);
    } else {
        if (attrs == NULL)
            return -1;
        return (X509at_add1_attr_by_OBJ(&attrs,
               OBJ_txt2obj(OID_GOST_CMS_MAC, 1),
               V_ASN1_OCTET_STRING, final_tag,
               mac_len) == NULL) ? -1 : 1;
    }
    return 1;
}